

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O0

local_m_extrapolation_t * __thiscall
tchecker::zg::details::local_m_extrapolation_t::operator=
          (local_m_extrapolation_t *this,local_m_extrapolation_t *e)

{
  local_m_extrapolation_t *e_local;
  local_m_extrapolation_t *this_local;
  
  if (this != e) {
    this->_m = e->_m;
    e->_m = (map_t *)0x0;
    std::shared_ptr<const_tchecker::clockbounds::local_m_map_t>::operator=
              (&this->_clock_bounds,&e->_clock_bounds);
  }
  return this;
}

Assistant:

tchecker::zg::details::local_m_extrapolation_t &
local_m_extrapolation_t::operator=(tchecker::zg::details::local_m_extrapolation_t && e)
{
  if (this != &e) {
    _m = std::move(e._m);
    e._m = nullptr;
    _clock_bounds = std::move(e._clock_bounds);
  }
  return *this;
}